

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *string;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  char buf [16];
  undefined8 uStack_40;
  byte local_38 [16];
  UNITY_DOUBLE local_28;
  
  if (input_number < 0.0) {
    uStack_40 = 0x101879;
    local_28 = input_number;
    putchar(0x2d);
    input_number = -local_28;
  }
  if ((input_number == 0.0) && (!NAN(input_number))) {
    string = "0";
LAB_001018b8:
    UnityPrint(string);
    return;
  }
  if (NAN(input_number)) {
    string = "nan";
    goto LAB_001018b8;
  }
  if (ABS(input_number) == INFINITY) {
    string = "inf";
    goto LAB_001018b8;
  }
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[8] = 0;
  local_38[9] = 0;
  local_38[10] = 0;
  local_38[0xb] = 0;
  local_38[0xc] = 0;
  local_38[0xd] = 0;
  local_38[0xe] = 0;
  local_38[0xf] = 0;
  fVar15 = 1.0;
  if (1.0 <= input_number) {
    if (input_number <= 1e+07) {
      iVar5 = (int)input_number;
      iVar2 = 0;
      if (iVar5 < 1000000) {
        iVar2 = 0;
        fVar15 = 1.0;
        iVar3 = iVar5;
        do {
          iVar5 = iVar3 * 10;
          fVar15 = fVar15 * 10.0;
          iVar2 = iVar2 + -1;
          bVar14 = iVar3 < 100000;
          iVar3 = iVar5;
        } while (bVar14);
      }
      input_number = (input_number - (float)(int)input_number) * fVar15;
    }
    else {
      iVar5 = 0;
      iVar2 = 0;
      for (; 1e+16 < input_number; input_number = input_number / 1e+10) {
        iVar2 = iVar2 + 10;
      }
      if (1e+07 < input_number) {
        fVar15 = 1.0;
        do {
          fVar15 = fVar15 * 10.0;
          iVar2 = iVar2 + 1;
          fVar1 = input_number / fVar15;
        } while (1e+07 < input_number / fVar15);
        goto LAB_00101999;
      }
    }
  }
  else {
    iVar5 = 0;
    iVar2 = 0;
    for (; input_number < 0.001; input_number = input_number * 1e+10) {
      iVar2 = iVar2 + -10;
    }
    if (input_number < 1e+06) {
      fVar15 = 1.0;
      do {
        fVar15 = fVar15 * 10.0;
        iVar2 = iVar2 + -1;
        fVar1 = input_number * fVar15;
      } while (input_number * fVar15 < 1e+06);
LAB_00101999:
      input_number = fVar1;
      iVar5 = 0;
    }
  }
  uVar4 = ((int)(input_number + input_number) - ((int)(input_number + input_number) + 1 >> 0x1f)) +
          1 >> 1;
  if ((((uVar4 & 1) != 0) && ((float)(int)uVar4 - input_number == 0.5)) &&
     (!NAN((float)(int)uVar4 - input_number))) {
    uVar4 = uVar4 - 1;
  }
  iVar5 = uVar4 + iVar5;
  iVar3 = 1000000;
  if (iVar5 < 10000000) {
    iVar3 = iVar5;
  }
  iVar6 = iVar2 + (uint)(9999999 < iVar5);
  uVar4 = 6;
  if (iVar2 + (uint)(9999999 < iVar5) + 10 < 0xb) {
    uVar4 = -iVar6;
  }
  uVar7 = iVar6 + uVar4;
  if (((int)uVar4 < 1) || (uVar10 = uVar4, iVar3 % 10 != 0)) {
    if ((iVar3 == 0) && ((int)uVar4 < 0)) goto LAB_00101b4e;
  }
  else {
    do {
      iVar3 = iVar3 / 10;
      uVar4 = uVar10 - 1;
      if (uVar10 < 2) break;
      uVar10 = uVar4;
    } while (iVar3 % 10 == 0);
  }
  lVar12 = 0;
  uVar10 = 1;
  do {
    do {
      uVar9 = uVar10;
      lVar8 = lVar12;
      iVar5 = iVar3 / 10;
      lVar12 = lVar8 + 1;
      local_38[lVar8] = (char)iVar3 + (char)iVar5 * -10 + 0x30;
      uVar11 = iVar3 - 10;
      uVar10 = uVar9 + 1;
      iVar3 = iVar5;
    } while (uVar11 < 0xffffffed);
  } while (lVar8 < (int)uVar4);
  if (0 < (int)lVar12) {
    lVar12 = (ulong)(uVar9 & 0x7fffffff) + 1;
    do {
      if (lVar12 - (ulong)uVar4 == 1) {
        uStack_40 = 0x101b3a;
        putchar(0x2e);
      }
      uStack_40 = 0x101b45;
      putchar((int)*(char *)((long)&uStack_40 + lVar12 + 6));
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
LAB_00101b4e:
  if (uVar7 != 0) {
    uStack_40 = 0x101b5c;
    putchar(0x65);
    if ((int)uVar7 < 0) {
      uStack_40 = 0x101b76;
      putchar(0x2d);
      uVar7 = -uVar7;
    }
    else {
      uStack_40 = 0x101b6a;
      putchar(0x2b);
    }
    uVar13 = 0xffffffffffffffff;
    do {
      local_38[uVar13 + 1] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
      bVar14 = 9 < uVar7;
      uVar13 = uVar13 + 1;
      uVar7 = uVar7 / 10;
    } while (uVar13 == 0 || bVar14);
    do {
      uStack_40 = 0x101bc1;
      putchar((int)(char)local_38[uVar13 & 0xffffffff]);
      uVar13 = uVar13 - 1;
    } while (1 < (int)uVar13 + 2);
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
#ifdef UNITY_INCLUDE_DOUBLE
    static const int sig_digits = 9;
    static const UNITY_INT32 min_scaled = 100000000;
    static const UNITY_INT32 max_scaled = 1000000000;
#else
    static const int sig_digits = 7;
    static const UNITY_INT32 min_scaled = 1000000;
    static const UNITY_INT32 max_scaled = 10000000;
#endif

    UNITY_DOUBLE number = input_number;

    /* print minus sign (does not handle negative zero) */
    if (number < 0.0f)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        UNITY_INT32 n_int = 0, n;
        int exponent = 0;
        int decimals, digits;
        char buf[16] = {0};

        /*
         * Scale up or down by powers of 10.  To minimize rounding error,
         * start with a factor/divisor of 10^10, which is the largest
         * power of 10 that can be represented exactly.  Finally, compute
         * (exactly) the remaining power of 10 and perform one more
         * multiplication or division.
         */
        if (number < 1.0f)
        {
            UNITY_DOUBLE factor = 1.0f;

            while (number < (UNITY_DOUBLE)max_scaled / 1e10f)  { number *= 1e10f; exponent -= 10; }
            while (number * factor < (UNITY_DOUBLE)min_scaled) { factor *= 10.0f; exponent--; }

            number *= factor;
        }
        else if (number > (UNITY_DOUBLE)max_scaled)
        {
            UNITY_DOUBLE divisor = 1.0f;

            while (number > (UNITY_DOUBLE)min_scaled * 1e10f)   { number  /= 1e10f; exponent += 10; }
            while (number / divisor > (UNITY_DOUBLE)max_scaled) { divisor *= 10.0f; exponent++; }

            number /= divisor;
        }
        else
        {
            /*
             * In this range, we can split off the integer part before
             * doing any multiplications.  This reduces rounding error by
             * freeing up significant bits in the fractional part.
             */
            UNITY_DOUBLE factor = 1.0f;
            n_int = (UNITY_INT32)number;
            number -= (UNITY_DOUBLE)n_int;

            while (n_int < min_scaled) { n_int *= 10; factor *= 10.0f; exponent--; }

            number *= factor;
        }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;

#ifndef UNITY_ROUND_TIES_AWAY_FROM_ZERO
        /* round to even if exactly between two integers */
        if ((n & 1) && (((UNITY_DOUBLE)n - number) == 0.5f))
            n--;
#endif

        n += n_int;

        if (n >= max_scaled)
        {
            n = min_scaled;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = ((exponent <= 0) && (exponent >= -(sig_digits + 3))) ? (-exponent) : (sig_digits - 1);
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while ((decimals > 0) && ((n % 10) == 0))
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while ((n != 0) || (digits < (decimals + 1)))
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if (digits == decimals) { UNITY_OUTPUT_CHAR('.'); }
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if (exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while ((exponent != 0) || (digits < 2))
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}